

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_c44f11::cmLBDepend::AddDependency
          (cmLBDepend *this,cmDependInformation *info,string *file)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  _Base_ptr p_Var3;
  cmDependInformation *info_00;
  long lVar4;
  cmDependInformation *pcVar5;
  _Rb_tree_node_base *p_Var6;
  _Alloc_node __an;
  bool bVar7;
  _Base_ptr p_Var8;
  
  info_00 = GetDependInformation(this,file,&info->PathOnly);
  GenerateDependInformation(this,info_00);
  if (info_00 == info) {
    return;
  }
  p_Var1 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var1->_M_header;
  if (p_Var3 == (_Base_ptr)0x0) {
LAB_002c26c8:
    if (p_Var8 == (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_002c26df;
    lVar4 = std::_Rb_tree_decrement(p_Var8);
    pcVar5 = *(cmDependInformation **)(lVar4 + 0x20);
  }
  else {
    do {
      p_Var8 = p_Var3;
      pcVar5 = *(cmDependInformation **)(p_Var8 + 1);
      p_Var3 = (&p_Var8->_M_left)[pcVar5 <= info_00];
    } while ((&p_Var8->_M_left)[pcVar5 <= info_00] != (_Base_ptr)0x0);
    if (info_00 < pcVar5) goto LAB_002c26c8;
  }
  if (info_00 <= pcVar5) {
    return;
  }
LAB_002c26df:
  if (p_Var1 == (_Rb_tree_header *)p_Var8) {
    bVar7 = true;
  }
  else {
    bVar7 = info_00 < *(cmDependInformation **)(p_Var8 + 1);
  }
  p_Var6 = (_Rb_tree_node_base *)operator_new(0x28);
  *(cmDependInformation **)(p_Var6 + 1) = info_00;
  std::_Rb_tree_insert_and_rebalance(bVar7,p_Var6,p_Var8,&p_Var1->_M_header);
  psVar2 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void AddDependency(cmDependInformation* info, const std::string& file)
  {
    cmDependInformation* dependInfo =
      this->GetDependInformation(file, info->PathOnly);
    this->GenerateDependInformation(dependInfo);
    info->AddDependencies(dependInfo);
  }